

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O0

void __thiscall
cali::AttributeExtract::AttributeExtractImpl::process_node
          (AttributeExtractImpl *this,CaliperMetadataAccessInterface *db,Node *node)

{
  initializer_list<cali::Entry> __l;
  Node *pNVar1;
  bool bVar2;
  cali_id_t cVar3;
  cali_variant_t cVar4;
  cali_variant_t local_e8;
  Attribute local_d8;
  Entry local_d0;
  allocator<cali::Entry> local_b1;
  Variant local_b0;
  Entry local_a0;
  Entry *local_88;
  size_type local_80;
  undefined1 local_78 [8];
  EntryList rec;
  allocator<char> local_49;
  string local_48 [32];
  Node *local_28;
  Node *local_20;
  Node *node_local;
  CaliperMetadataAccessInterface *db_local;
  AttributeExtractImpl *this_local;
  
  local_20 = node;
  node_local = (Node *)db;
  db_local = (CaliperMetadataAccessInterface *)this;
  cVar3 = Node::attribute(node);
  if (cVar3 == 8) {
    bVar2 = Attribute::operator_cast_to_bool(&this->m_id_attr);
    pNVar1 = node_local;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,"attribute.id",&local_49);
      local_28 = (Node *)(**(code **)(*(long *)pNVar1 + 0x20))(pNVar1,local_48,3,1,0,0,0);
      (this->m_id_attr).m_node = local_28;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    cVar3 = Node::id(local_20);
    Variant::Variant<unsigned_long,_0>(&local_b0,cVar3);
    Entry::Entry(&local_a0,&this->m_id_attr,&local_b0);
    local_80 = 1;
    local_88 = &local_a0;
    std::allocator<cali::Entry>::allocator(&local_b1);
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::vector<cali::Entry,_std::allocator<cali::Entry>_>::vector
              ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_78,__l,&local_b1);
    std::allocator<cali::Entry>::~allocator(&local_b1);
    while( true ) {
      bVar2 = false;
      if (local_20 != (Node *)0x0) {
        cVar3 = Node::id(local_20);
        bVar2 = cVar3 != 0xffffffffffffffff;
      }
      pNVar1 = node_local;
      if (!bVar2) break;
      cVar3 = Node::attribute(local_20);
      local_d8.m_node = (Node *)(**(code **)(*(long *)pNVar1 + 8))(pNVar1,cVar3);
      cVar4 = (cali_variant_t)Node::data(local_20);
      local_e8 = cVar4;
      Entry::Entry(&local_d0,&local_d8,(Variant *)&local_e8);
      std::vector<cali::Entry,_std::allocator<cali::Entry>_>::push_back
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_78,&local_d0);
      local_20 = util::LockfreeIntrusiveTree<cali::Node>::parent
                           ((LockfreeIntrusiveTree<cali::Node> *)local_20);
    }
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::operator()(&this->m_snap_fn,(CaliperMetadataAccessInterface *)node_local,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_78);
    std::vector<cali::Entry,_std::allocator<cali::Entry>_>::~vector
              ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_78);
  }
  return;
}

Assistant:

void process_node(CaliperMetadataAccessInterface& db, const Node* node)
    {
        if (node->attribute() != s_attr_id)
            return;

        if (!m_id_attr)
            m_id_attr = db.create_attribute("attribute.id", CALI_TYPE_UINT, CALI_ATTR_ASVALUE);

        EntryList rec { Entry(m_id_attr, node->id()) };

        for (; node && node->id() != CALI_INV_ID; node = node->parent())
            rec.push_back(Entry(db.get_attribute(node->attribute()), node->data()));

        m_snap_fn(db, rec);
    }